

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O0

uchar hex_value(char c)

{
  ushort **ppuVar1;
  uchar local_9;
  char c_local;
  
  ppuVar1 = __ctype_b_loc();
  if (((*ppuVar1)[(int)c] & 0x800) == 0) {
    switch(c) {
    case 'A':
    case 'a':
      local_9 = '\n';
      break;
    case 'B':
    case 'b':
      local_9 = '\v';
      break;
    case 'C':
    case 'c':
      local_9 = '\f';
      break;
    case 'D':
    case 'd':
      local_9 = '\r';
      break;
    case 'E':
    case 'e':
      local_9 = '\x0e';
      break;
    case 'F':
    case 'f':
      local_9 = '\x0f';
      break;
    default:
      local_9 = 0xff;
    }
  }
  else {
    local_9 = c + 0xd0;
  }
  return local_9;
}

Assistant:

static unsigned char hex_value (json_char c)
{
   if (isdigit(c))
      return c - '0';

   switch (c) {
      case 'a': case 'A': return 0x0A;
      case 'b': case 'B': return 0x0B;
      case 'c': case 'C': return 0x0C;
      case 'd': case 'D': return 0x0D;
      case 'e': case 'E': return 0x0E;
      case 'f': case 'F': return 0x0F;
      default: return 0xFF;
   }
}